

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

void duckdb_bind_add_result_column(duckdb_bind_info info,char *name,duckdb_logical_type type)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar1;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (type != (duckdb_logical_type)0x0 && (name != (char *)0x0 && info != (duckdb_bind_info)0x0)) {
    bVar1 = duckdb::TypeVisitor::Contains((LogicalType *)type,INVALID);
    if (!bVar1) {
      bVar1 = duckdb::TypeVisitor::Contains((LogicalType *)type,ANY);
      if (!bVar1) {
        this = *(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)(info + 0x18);
        std::__cxx11::string::string((string *)&local_48,name,&local_49);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (*(vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> **)
                    (info + 0x10),(value_type *)type);
      }
    }
  }
  return;
}

Assistant:

void duckdb_bind_add_result_column(duckdb_bind_info info, const char *name, duckdb_logical_type type) {
	if (!info || !name || !type) {
		return;
	}
	auto logical_type = reinterpret_cast<duckdb::LogicalType *>(type);
	if (duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::INVALID) ||
	    duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::ANY)) {
		return;
	}

	auto &bind_info = GetCBindInfo(info);
	bind_info.names.push_back(name);
	bind_info.return_types.push_back(*logical_type);
}